

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psstack.c
# Opt level: O3

CF2_F16Dot16 cf2_stack_getReal(CF2_Stack stack,FT_UFast idx)

{
  CF2_StackNumber *pCVar1;
  int *piVar2;
  int iVar3;
  
  pCVar1 = stack->buffer;
  if (idx < (uint)((ulong)((long)stack->top - (long)pCVar1) >> 3)) {
    iVar3 = pCVar1[idx].u.r;
    if (pCVar1[idx].type == CF2_NumberFrac) {
      if (-1 < iVar3) {
        return iVar3 + 0x2000U >> 0xe;
      }
      return -(0x2000U - iVar3 >> 0xe);
    }
    if (pCVar1[idx].type == CF2_NumberInt) {
      return iVar3 << 0x10;
    }
  }
  else {
    piVar2 = stack->error;
    iVar3 = 0;
    if ((piVar2 != (int *)0x0) && (*piVar2 == 0)) {
      *piVar2 = 0x82;
      return 0;
    }
  }
  return iVar3;
}

Assistant:

FT_LOCAL_DEF( CF2_Fixed )
  cf2_stack_getReal( CF2_Stack  stack,
                     CF2_UInt   idx )
  {
    FT_ASSERT( cf2_stack_count( stack ) <= stack->stackSize );

    if ( idx >= cf2_stack_count( stack ) )
    {
      CF2_SET_ERROR( stack->error, Stack_Overflow );
      return cf2_intToFixed( 0 );    /* bounds error */
    }

    switch ( stack->buffer[idx].type )
    {
    case CF2_NumberInt:
      return cf2_intToFixed( stack->buffer[idx].u.i );
    case CF2_NumberFrac:
      return cf2_fracToFixed( stack->buffer[idx].u.f );
    default:
      return stack->buffer[idx].u.r;
    }
  }